

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O2

int fillpara(int f,int n)

{
  char cVar1;
  int iVar2;
  int iVar3;
  line *plVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  line *plVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  byte bVar13;
  bool bVar14;
  undefined8 uStack_160;
  byte local_158 [8];
  char wbuf [256];
  
  if (n == 0) {
    return 1;
  }
  uStack_160 = 0x1137c9;
  undo_boundary_enable(8,0);
  uStack_160 = 0x1137d3;
  gotoeop(8,1);
  if (curwp->w_doto == 0) {
    plVar8 = (line *)&curwp->w_dotp;
  }
  else {
    uStack_160 = 0x1137e8;
    lnewline();
    plVar8 = curwp->w_dotp;
  }
  plVar8 = plVar8->l_fp;
  bVar5 = true;
  uStack_160 = 0x113816;
  gotobop(8,1);
  do {
    uStack_160 = 0x11381b;
    iVar6 = inword();
    if (iVar6 != 0) break;
    uStack_160 = 0x113829;
    iVar6 = forwchar(8,1);
  } while (iVar6 != 0);
  iVar6 = curwp->w_doto;
  bVar14 = false;
  do {
    uVar12 = 0;
LAB_00113841:
    do {
      uVar9 = uVar12;
      if (bVar14) {
        uStack_160 = 0x113a78;
        lnewline();
        uStack_160 = 0x113a87;
        iVar11 = 1;
        backchar(8,1);
LAB_00113a87:
        uStack_160 = 0x113a92;
        undo_boundary_enable(8,1);
        return iVar11;
      }
      iVar2 = curwp->w_doto;
      plVar4 = curwp->w_dotp;
      iVar3 = plVar4->l_used;
      if (iVar2 == iVar3) {
        bVar14 = plVar4->l_fp == plVar8;
        bVar13 = 0x20;
      }
      else {
        bVar13 = plVar4->l_text[iVar2];
        bVar14 = false;
      }
      iVar11 = 0;
      uStack_160 = 0x11388d;
      iVar7 = ldelete(1,0);
      if (iVar7 == 0 && !bVar14) goto LAB_00113a87;
      if ((bVar13 != 9) && (bVar13 != 0x20)) {
        if ((int)uVar9 < 0xff) {
          local_158[(int)uVar9] = bVar13;
          uVar12 = uVar9 + 1;
        }
        else {
          uStack_160 = 0x1138c7;
          ewprintf("Word too long!");
          uVar12 = uVar9;
        }
        goto LAB_00113841;
      }
      uVar12 = 0;
    } while (uVar9 == 0);
    uVar12 = uVar9;
    if ((!bVar14) && (dblspace != 0)) {
      if (iVar2 != iVar3) {
        if (((curwp->w_doto != curwp->w_dotp->l_used) &&
            (cVar1 = curwp->w_dotp->l_text[curwp->w_doto], cVar1 != ' ')) && (cVar1 != '\t'))
        goto LAB_001139c0;
      }
      if ((cinfo[local_158[(long)(int)uVar9 + -1]] & 0x10U) == 0) {
        if ((1 < (int)uVar9 && local_158[(long)(int)uVar9 + -1] == 0x29) &&
           (((byte)cinfo[local_158[uVar9 - 2]] >> 4 & uVar9 < 0xff) != 0)) {
LAB_001139b4:
          local_158[(int)uVar9] = 0x20;
          uVar12 = uVar9 + 1;
        }
      }
      else if ((int)uVar9 < 0xff) goto LAB_001139b4;
    }
LAB_001139c0:
    if (fillcol < (int)(iVar6 + uVar9 + 1)) {
      if ((0 < curwp->w_doto) && (uVar9 = curwp->w_doto - 1, curwp->w_dotp->l_text[uVar9] == ' ')) {
        curwp->w_doto = uVar9;
        uStack_160 = 0x1139fe;
        ldelete(1,0);
      }
      uStack_160 = 0x113a03;
      lnewline();
      iVar6 = 0;
    }
    else {
      if (!bVar5) {
        iVar6 = iVar6 + 1;
        uStack_160 = 0x113a2c;
        linsert(1,0x20);
      }
      bVar5 = false;
    }
    if ((int)uVar12 < 1) {
      uVar12 = 0;
    }
    for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
      uStack_160 = 0x113a5b;
      linsert(1,(int)(char)local_158[uVar10]);
    }
    iVar6 = iVar6 + uVar12;
  } while( true );
}

Assistant:

int
fillpara(int f, int n)
{
	int	 c;		/* current char during scan		*/
	int	 wordlen;	/* length of current word		*/
	int	 clength;	/* position on line during fill		*/
	int	 i;		/* index during word copy		*/
	int	 eopflag;	/* Are we at the End-Of-Paragraph?	*/
	int	 firstflag;	/* first word? (needs no space)		*/
	int	 newlength;	/* tentative new line length		*/
	int	 eolflag;	/* was at end of line			*/
	int	 retval;	/* return value				*/
	struct line	*eopline;	/* pointer to line just past EOP	*/
	char	 wbuf[MAXWORD];	/* buffer for current word		*/

	if (n == 0)
		return (TRUE);

	undo_boundary_enable(FFRAND, 0);

	/* record the pointer to the line just past the EOP */
	(void)gotoeop(FFRAND, 1);
	if (curwp->w_doto != 0) {
		/* paragraph ends at end of buffer */
		(void)lnewline();
		eopline = lforw(curwp->w_dotp);
	} else
		eopline = curwp->w_dotp;

	/* and back top the beginning of the paragraph */
	(void)gotobop(FFRAND, 1);

	/* initialize various info */
	while (inword() == 0 && forwchar(FFRAND, 1));

	clength = curwp->w_doto;
	wordlen = 0;

	/* scan through lines, filling words */
	firstflag = TRUE;
	eopflag = FALSE;
	while (!eopflag) {

		/* get the next character in the paragraph */
		if ((eolflag = (curwp->w_doto == llength(curwp->w_dotp)))) {
			c = ' ';
			if (lforw(curwp->w_dotp) == eopline)
				eopflag = TRUE;
		} else
			c = lgetc(curwp->w_dotp, curwp->w_doto);

		/* and then delete it */
		if (ldelete((RSIZE) 1, KNONE) == FALSE && !eopflag) {
			retval = FALSE;
			goto cleanup;
		}

		/* if not a separator, just add it in */
		if (c != ' ' && c != '\t') {
			if (wordlen < MAXWORD - 1)
				wbuf[wordlen++] = c;
			else {
				/*
				 * You lose chars beyond MAXWORD if the word
				 * is too long. I'm too lazy to fix it now; it
				 * just silently truncated the word before,
				 * so I get to feel smug.
				 */
				ewprintf("Word too long!");
			}
		} else if (wordlen) {

			/* calculate tentative new length with word added */
			newlength = clength + 1 + wordlen;

			/*
			 * if at end of line or at doublespace and previous
			 * character was one of '.','?','!' doublespace here.
			 * behave the same way if a ')' is preceded by a
			 * [.?!] and followed by a doublespace.
			 */
			if (dblspace && (!eopflag && ((eolflag ||
			    curwp->w_doto == llength(curwp->w_dotp) ||
			    (c = lgetc(curwp->w_dotp, curwp->w_doto)) == ' '
			    || c == '\t') && (ISEOSP(wbuf[wordlen - 1]) ||
			    (wbuf[wordlen - 1] == ')' && wordlen >= 2 &&
			    ISEOSP(wbuf[wordlen - 2])))) &&
			    wordlen < MAXWORD - 1))
				wbuf[wordlen++] = ' ';

			/* at a word break with a word waiting */
			if (newlength <= fillcol) {
				/* add word to current line */
				if (!firstflag) {
					(void)linsert(1, ' ');
					++clength;
				}
				firstflag = FALSE;
			} else {
				if (curwp->w_doto > 0 &&
				    lgetc(curwp->w_dotp, curwp->w_doto - 1) == ' ') {
					curwp->w_doto -= 1;
					(void)ldelete((RSIZE) 1, KNONE);
				}
				/* start a new line */
				(void)lnewline();
				clength = 0;
			}

			/* and add the word in in either case */
			for (i = 0; i < wordlen; i++) {
				(void)linsert(1, wbuf[i]);
				++clength;
			}
			wordlen = 0;
		}
	}
	/* and add a last newline for the end of our new paragraph */
	(void)lnewline();

	/*
	 * We really should wind up where we started, (which is hard to keep
	 * track of) but I think the end of the last line is better than the
	 * beginning of the blank line.
	 */
	(void)backchar(FFRAND, 1);
	retval = TRUE;
cleanup:
	undo_boundary_enable(FFRAND, 1);
	return (retval);
}